

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# export.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_1aacf::IDLExportVisitor::setTargetNamespace
          (IDLExportVisitor *this,string *target_namespace)

{
  size_t sVar1;
  undefined1 *local_38 [2];
  undefined1 local_28 [16];
  
  sVar1 = namespaceIndentLevel(target_namespace);
  local_38[0] = local_28;
  std::__cxx11::string::_M_construct((ulong)local_38,(char)sVar1 * '\x04');
  std::__cxx11::string::operator=((string *)&this->m_indent,(string *)local_38);
  std::__cxx11::string::~string((string *)local_38);
  std::__cxx11::string::_M_assign((string *)&this->m_namespace);
  return;
}

Assistant:

void setTargetNamespace(std::string const& target_namespace)
        {
            size_t ns_size = namespaceIndentLevel(target_namespace);
            m_indent = string(ns_size * 4, ' ');
            m_namespace = target_namespace;
        }